

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_time.c
# Opt level: O1

uint32_t unix_to_dos(int64_t unix_time)

{
  uint32_t uVar1;
  tm *ptVar2;
  time_t ut;
  tm_conflict tmbuf;
  int64_t local_58;
  tm local_50;
  
  local_58 = unix_time;
  if (dos_initialised == '\0') {
    local_50.tm_mon = 0xb;
    local_50.tm_year = 0xcf;
    local_50.tm_hour = 0x17;
    local_50.tm_mday = 0x1f;
    local_50.tm_sec = 0x3a;
    local_50.tm_min = 0x3b;
    local_50.tm_isdst = -1;
    dos_max_unix = mktime(&local_50);
    local_50.tm_mon = 0;
    local_50.tm_year = 0x50;
    local_50.tm_hour = 0;
    local_50.tm_mday = 1;
    local_50.tm_sec = 0;
    local_50.tm_min = 0;
    local_50.tm_isdst = -1;
    dos_min_unix = mktime(&local_50);
    dos_initialised = '\x01';
  }
  uVar1 = 0xff9fbf7d;
  if ((unix_time < dos_max_unix) && (uVar1 = 0x210000, dos_min_unix < unix_time)) {
    ptVar2 = localtime_r(&local_58,&local_50);
    uVar1 = ((ptVar2->tm_min & 0x3fU) << 5 |
            (ptVar2->tm_hour & 0x1fU) << 0xb |
            (ptVar2->tm_mday & 0x1fU | ptVar2->tm_mon * 0x20 + 0x20U & 0x1e0 | ptVar2->tm_year << 9)
            << 0x10) + ((uint)ptVar2->tm_sec >> 1 & 0x1f) + 0x60000000;
  }
  return uVar1;
}

Assistant:

uint32_t
unix_to_dos(int64_t unix_time)
{
	struct tm *t;
	uint32_t dt;
	time_t ut = unix_time;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif

	if (!dos_initialised) {
		dos_max_unix = dos_to_unix(DOS_MAX_TIME);
		dos_min_unix = dos_to_unix(DOS_MIN_TIME);
		dos_initialised = 1;
	}
	if (unix_time >= dos_max_unix) {
		return DOS_MAX_TIME;
	}
	else if(unix_time <= dos_min_unix) {
		return DOS_MIN_TIME;
	}
	else {
#if defined(HAVE_LOCALTIME_S)
		t = localtime_s(&tmbuf, &ut) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
		t = localtime_r(&ut, &tmbuf);
#else
		t = localtime(&ut);
#endif
		dt = 0;
		dt += ((t->tm_year - 80) & 0x7f) << 9;
		dt += ((t->tm_mon + 1) & 0x0f) << 5;
		dt += (t->tm_mday & 0x1f);
		dt <<= 16;
		dt += (t->tm_hour & 0x1f) << 11;
		dt += (t->tm_min & 0x3f) << 5;
		dt += (t->tm_sec & 0x3e) >> 1; /* Only counting every 2 seconds. */
		return dt;
	}
}